

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::mark_as_packable(CompilerMSL *this,SPIRType *type)

{
  uint32_t uVar1;
  size_t sVar2;
  SPIRType *pSVar3;
  uint32_t mbr_idx;
  ulong uVar4;
  
  while (uVar1 = (type->parent_type).id, uVar1 != 0) {
    type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar1);
  }
  if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
    Compiler::set_extended_decoration
              ((Compiler *)this,(type->super_IVariant).self.id,
               SPIRVCrossDecorationBufferBlockRepacked,0);
    sVar2 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    for (uVar4 = 0; (uint)sVar2 != uVar4; uVar4 = uVar4 + 1) {
      pSVar3 = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,
                          (type->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar4].
                          id);
      mark_as_packable(this,pSVar3);
      uVar1 = (pSVar3->type_alias).id;
      if (uVar1 != 0) {
        pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar1);
        mark_as_packable(this,pSVar3);
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::mark_as_packable(SPIRType &type)
{
	// If this is not the base type (eg. it's a pointer or array), tunnel down
	if (type.parent_type)
	{
		mark_as_packable(get<SPIRType>(type.parent_type));
		return;
	}

	if (type.basetype == SPIRType::Struct)
	{
		set_extended_decoration(type.self, SPIRVCrossDecorationBufferBlockRepacked);

		// Recurse
		uint32_t mbr_cnt = uint32_t(type.member_types.size());
		for (uint32_t mbr_idx = 0; mbr_idx < mbr_cnt; mbr_idx++)
		{
			uint32_t mbr_type_id = type.member_types[mbr_idx];
			auto &mbr_type = get<SPIRType>(mbr_type_id);
			mark_as_packable(mbr_type);
			if (mbr_type.type_alias)
			{
				auto &mbr_type_alias = get<SPIRType>(mbr_type.type_alias);
				mark_as_packable(mbr_type_alias);
			}
		}
	}
}